

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaElementDecl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SchemaElementDecl::SchemaElementDecl
          (SchemaElementDecl *this,XMLCh *prefix,XMLCh *localPart,int uriId,ModelTypes type,
          uint enclosingScope,MemoryManager *manager)

{
  XMLElementDecl::XMLElementDecl(&this->super_XMLElementDecl,manager);
  (this->super_XMLElementDecl).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__SchemaElementDecl_0040efc8;
  *(ModelTypes *)&(this->super_XMLElementDecl).field_0x2c = type;
  this->fPSVIScope = SCP_ABSENT;
  this->fEnclosingScope = enclosingScope;
  this->fFinalSet = 0;
  this->fBlockSet = 0;
  this->fMiscFlags = 0;
  this->fDefaultValue = (XMLCh *)0x0;
  this->fComplexTypeInfo = (ComplexTypeInfo *)0x0;
  this->fAttDefs = (RefHash2KeysTableOf<xercesc_4_0::SchemaAttDef,_xercesc_4_0::StringHasher> *)0x0;
  this->fIdentityConstraints = (RefVectorOf<xercesc_4_0::IdentityConstraint> *)0x0;
  this->fAttWildCard = (SchemaAttDef *)0x0;
  this->fSubstitutionGroupElem = (SchemaElementDecl *)0x0;
  this->fDatatypeValidator = (DatatypeValidator *)0x0;
  XMLElementDecl::setElementName(&this->super_XMLElementDecl,prefix,localPart,uriId);
  return;
}

Assistant:

SchemaElementDecl::SchemaElementDecl(const XMLCh* const                  prefix
                                   , const XMLCh* const                  localPart
                                   , const int                           uriId
                                   , const SchemaElementDecl::ModelTypes type
                                   , const unsigned int                  enclosingScope
                                   , MemoryManager* const                manager) :
    XMLElementDecl(manager)
    , fModelType(type)
    , fPSVIScope(PSVIDefs::SCP_ABSENT)
    , fEnclosingScope(enclosingScope)
    , fFinalSet(0)
    , fBlockSet(0)    
    , fMiscFlags(0)
    , fDefaultValue(0)
    , fComplexTypeInfo(0)
    , fAttDefs(0)          
    , fIdentityConstraints(0)
    , fAttWildCard(0)
    , fSubstitutionGroupElem(0)
    , fDatatypeValidator(0)
{
    setElementName(prefix, localPart, uriId);
}